

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall
QPDFWriter::writeObject(QPDFWriter *this,QPDFObjectHandle *object,int object_stream_index)

{
  uint uVar1;
  long lVar2;
  ulong __val;
  uint uVar3;
  uint uVar4;
  char cVar5;
  bool bVar6;
  _Base_ptr p_Var7;
  Object *pOVar8;
  const_iterator cVar9;
  uint *puVar10;
  long *plVar11;
  uint uVar12;
  _Base_ptr p_Var13;
  size_t __n;
  long *plVar14;
  _Base_ptr p_Var15;
  ulong uVar16;
  char cVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  element_type *peVar21;
  string __str;
  QPDFObjGen old_og;
  long *local_e0;
  void *local_d8;
  long local_d0;
  long lStack_c8;
  int local_bc;
  QPDFObjGen local_b8;
  QPDFObjectHandle *local_b0;
  QPDFObjectHandle local_a8;
  QPDFObjectHandle local_98;
  QPDFObjectHandle local_88;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  QPDFObjGen local_38;
  
  local_b8 = QPDFObjectHandle::getObjGen(object);
  iVar19 = local_b8.obj;
  if ((ulong)local_b8 >> 0x20 == 0 && object_stream_index == -1) {
    peVar21 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var13 = *(_Base_ptr *)
               ((long)&(peVar21->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header + 8);
    if (p_Var13 != (_Base_ptr)0x0) {
      p_Var7 = &(peVar21->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var15 = p_Var7;
      do {
        if (iVar19 <= (int)p_Var13[1]._M_color) {
          p_Var15 = p_Var13;
        }
        p_Var13 = (&p_Var13->_M_left)[(int)p_Var13[1]._M_color < iVar19];
      } while (p_Var13 != (_Base_ptr)0x0);
      if ((p_Var15 != p_Var7) && ((int)p_Var15[1]._M_color <= iVar19)) {
        local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (object->super_BaseHandle).obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (object->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_88.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_88.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_88.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
            _M_use_count = (local_88.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_M_use_count + 1;
          }
        }
        writeObjectStream(this,&local_88);
        if (local_88.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        return;
      }
    }
  }
  indicateProgress(this,false,false);
  peVar21 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar18 = (ulong)iVar19;
  lVar2 = *(long *)&(peVar21->obj).super_ObjTable<QPDFWriter::Object>.
                    super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                    super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                    _M_impl;
  __n = (long)*(pointer *)
               ((long)&(peVar21->obj).super_ObjTable<QPDFWriter::Object>.
                       super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                       super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_> +
               8) - lVar2 >> 2;
  if (__n * -0x5555555555555555 < uVar18 || __n * -0x5555555555555555 - uVar18 == 0) {
    pOVar8 = ObjTable<QPDFWriter::Object>::large_element
                       (&(peVar21->obj).super_ObjTable<QPDFWriter::Object>,uVar18);
    peVar21 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    __n = uVar18 * 3;
    pOVar8 = (Object *)(lVar2 + uVar18 * 0xc);
  }
  iVar19 = pOVar8->renumber;
  if (peVar21->qdf_mode == true) {
    local_bc = object_stream_index;
    cVar9 = std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
            ::find(&(peVar21->page_object_to_seq)._M_t,&local_b8);
    local_b0 = object;
    if (cVar9._M_node != &(peVar21->page_object_to_seq)._M_t._M_impl.super__Rb_tree_header._M_header
       ) {
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27bcdf,(void *)0x8,__n);
      puVar10 = (uint *)std::
                        map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                        ::operator[](&((this->m).
                                       super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->page_object_to_seq,&local_b8);
      uVar1 = *puVar10;
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      uVar20 = 1;
      if (9 < uVar3) {
        __n = (size_t)uVar3;
        uVar4 = 4;
        do {
          uVar20 = uVar4;
          uVar12 = (uint)__n;
          if (uVar12 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_001efbdd;
          }
          if (uVar12 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_001efbdd;
          }
          if (uVar12 < 10000) goto LAB_001efbdd;
          __n = __n / 10000;
          uVar4 = uVar20 + 4;
        } while (99999 < uVar12);
        uVar20 = uVar20 + 1;
      }
LAB_001efbdd:
      local_e0 = &local_d0;
      std::__cxx11::string::_M_construct((ulong)&local_e0,(char)uVar20 - (char)((int)uVar1 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_e0 + (ulong)(uVar1 >> 0x1f)),uVar20,uVar3);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_e0,local_d8,__n);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27bdf7,(void *)0x1,__n);
    }
    object = local_b0;
    peVar21 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    cVar9 = std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_int>,_std::_Select1st<std::pair<const_QPDFObjGen,_int>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
            ::find(&(peVar21->contents_to_page_seq)._M_t,&local_b8);
    object_stream_index = local_bc;
    if (cVar9._M_node !=
        &(peVar21->contents_to_page_seq)._M_t._M_impl.super__Rb_tree_header._M_header) {
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27bce8,(void *)0x15,__n);
      puVar10 = (uint *)std::
                        map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>
                        ::operator[](&((this->m).
                                       super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->contents_to_page_seq,&local_b8);
      uVar1 = *puVar10;
      uVar3 = -uVar1;
      if (0 < (int)uVar1) {
        uVar3 = uVar1;
      }
      uVar20 = 1;
      if (9 < uVar3) {
        __n = (size_t)uVar3;
        uVar4 = 4;
        do {
          uVar20 = uVar4;
          uVar12 = (uint)__n;
          if (uVar12 < 100) {
            uVar20 = uVar20 - 2;
            goto LAB_001efd26;
          }
          if (uVar12 < 1000) {
            uVar20 = uVar20 - 1;
            goto LAB_001efd26;
          }
          if (uVar12 < 10000) goto LAB_001efd26;
          __n = __n / 10000;
          uVar4 = uVar20 + 4;
        } while (99999 < uVar12);
        uVar20 = uVar20 + 1;
      }
LAB_001efd26:
      local_e0 = &local_d0;
      std::__cxx11::string::_M_construct((ulong)&local_e0,(char)uVar20 - (char)((int)uVar1 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((long)local_e0 + (ulong)(uVar1 >> 0x1f)),uVar20,uVar3);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_e0,local_d8,__n);
      object_stream_index = local_bc;
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,0x27bdf7,(void *)0x1,__n);
      object = local_b0;
    }
  }
  if (object_stream_index == -1) {
    peVar21 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar21->qdf_mode == true) && (peVar21->suppress_original_object_ids == false)) {
      local_38 = QPDFObjectHandle::getObjGen(object);
      QPDFObjGen::unparse_abi_cxx11_(&local_58,&local_38,' ');
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x27bcfe);
      plVar14 = plVar11 + 2;
      if ((long *)*plVar11 == plVar14) {
        local_68 = *plVar14;
        lStack_60 = plVar11[3];
        local_78 = &local_68;
      }
      else {
        local_68 = *plVar14;
        local_78 = (long *)*plVar11;
      }
      local_70 = plVar11[1];
      *plVar11 = (long)plVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_78);
      plVar14 = plVar11 + 2;
      if ((long *)*plVar11 == plVar14) {
        local_d0 = *plVar14;
        lStack_c8 = plVar11[3];
        local_e0 = &local_d0;
      }
      else {
        local_d0 = *plVar14;
        local_e0 = (long *)*plVar11;
      }
      local_d8 = (void *)plVar11[1];
      *plVar11 = (long)plVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_e0,local_d8,(size_t)plVar14);
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,local_d0 + 1);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78,local_68 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    openObject(this,iVar19);
    setDataKey(this,iVar19);
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_98.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    uVar18 = 0;
    unparseObject(this,&local_98,0,0,0,false);
    if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    peVar21 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (peVar21->cur_data_key)._M_string_length = 0;
    *(peVar21->cur_data_key)._M_dataplus._M_p = '\0';
    closeObject(this,iVar19);
  }
  else {
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
    local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (object->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_a8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _M_use_count + 1;
      }
    }
    uVar18 = 4;
    unparseObject(this,&local_a8,0,4,0,false);
    if (local_a8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27bdf7,(void *)0x1,uVar18);
  }
  if ((((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       direct_stream_lengths == false) && (bVar6 = QPDFObjectHandle::isStream(object), bVar6)) {
    peVar21 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar21->qdf_mode == true) && (peVar21->added_newline == true)) {
      ::qpdf::pl::Count::write(peVar21->pipeline,0x27bd16,(void *)0x15,uVar18);
    }
    openObject(this,iVar19 + 1);
    __val = ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            cur_stream_length;
    cVar17 = '\x01';
    if (9 < __val) {
      uVar18 = __val;
      cVar5 = '\x04';
      do {
        cVar17 = cVar5;
        if (uVar18 < 100) {
          cVar17 = cVar17 + -2;
          goto LAB_001f00e9;
        }
        if (uVar18 < 1000) {
          cVar17 = cVar17 + -1;
          goto LAB_001f00e9;
        }
        if (uVar18 < 10000) goto LAB_001f00e9;
        uVar16 = uVar18 / 10000;
        bVar6 = 99999 < uVar18;
        uVar18 = uVar16;
        cVar5 = cVar17 + '\x04';
      } while (bVar6);
      cVar17 = cVar17 + '\x01';
    }
LAB_001f00e9:
    local_e0 = &local_d0;
    std::__cxx11::string::_M_construct((ulong)&local_e0,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_e0,(uint)local_d8,__val);
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_e0,local_d8,uVar18);
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    closeObject(this,iVar19 + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::writeObject(QPDFObjectHandle object, int object_stream_index)
{
    QPDFObjGen old_og = object.getObjGen();

    if ((object_stream_index == -1) && (old_og.getGen() == 0) &&
        (m->object_stream_to_objects.count(old_og.getObj()))) {
        writeObjectStream(object);
        return;
    }

    indicateProgress(false, false);
    auto new_id = m->obj[old_og].renumber;
    if (m->qdf_mode) {
        if (m->page_object_to_seq.count(old_og)) {
            writeString("%% Page ");
            writeString(std::to_string(m->page_object_to_seq[old_og]));
            writeString("\n");
        }
        if (m->contents_to_page_seq.count(old_og)) {
            writeString("%% Contents for page ");
            writeString(std::to_string(m->contents_to_page_seq[old_og]));
            writeString("\n");
        }
    }
    if (object_stream_index == -1) {
        if (m->qdf_mode && (!m->suppress_original_object_ids)) {
            writeString("%% Original object ID: " + object.getObjGen().unparse(' ') + "\n");
        }
        openObject(new_id);
        setDataKey(new_id);
        unparseObject(object, 0, 0);
        m->cur_data_key.clear();
        closeObject(new_id);
    } else {
        unparseObject(object, 0, f_in_ostream);
        writeString("\n");
    }

    if ((!m->direct_stream_lengths) && object.isStream()) {
        if (m->qdf_mode) {
            if (m->added_newline) {
                writeString("%QDF: ignore_newline\n");
            }
        }
        openObject(new_id + 1);
        writeString(std::to_string(m->cur_stream_length));
        closeObject(new_id + 1);
    }
}